

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp128.hpp
# Opt level: O3

uint duckdb::Chimp128Decompression<unsigned_int>::DecompressValue
               (Flags flag,uint8_t *leading_zeros,uint32_t *leading_zero_index,
               UnpackedData *unpacked_data,uint32_t *unpacked_index,DecompressState *state)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  InternalException *this;
  sbyte sVar7;
  uint8_t uVar8;
  byte bVar9;
  uint64_t uVar10;
  uint uVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  undefined7 in_register_00000039;
  ulong uVar15;
  uint8_t *puVar16;
  ulong uVar17;
  ulong uVar18;
  string local_50;
  
  uVar15 = CONCAT71(in_register_00000039,flag) & 0xffffffff;
  switch(uVar15) {
  case 0:
    uVar6 = (state->input).index;
    uVar5 = uVar6 & 7;
    puVar16 = (state->input).input;
    bVar12 = puVar16[uVar6 >> 3];
    bVar9 = BitReader::REMAINDER_MASKS[(ulong)uVar5 + 7];
    bVar1 = puVar16[((ulong)(uVar6 >> 3) + 1) - (ulong)((ulong)uVar5 == 0)];
    (state->input).index = uVar6 + 7;
    uVar6 = (uint)(state->ring_buffer).buffer
                  [(uint)(byte)((bVar9 & bVar1) >> (1U - (char)uVar6 & 7)) |
                   ((uint)bVar12 << (sbyte)uVar5) >> 1 & 0x7f];
    goto LAB_010379d4;
  case 1:
    uVar6 = *unpacked_index;
    *unpacked_index = uVar6 + 1;
    uVar8 = unpacked_data[uVar6].leading_zero;
    state->leading_zeros = uVar8;
    bVar9 = 0x20 - (uVar8 + unpacked_data[uVar6].significant_bits);
    state->trailing_zeros = bVar9;
    bVar12 = unpacked_data[uVar6].significant_bits;
    if (bVar12 < 8) {
      uVar5 = (state->input).index;
      puVar16 = (state->input).input;
      uVar11 = uVar5 & 7;
      uVar18 = (ulong)(uVar5 >> 3);
      uVar17 = 0;
      uVar13 = 0;
    }
    else {
      uVar17 = (ulong)(bVar12 >> 3);
      puVar16 = (state->input).input;
      uVar5 = (state->input).index;
      uVar18 = (ulong)(uVar5 >> 3);
      uVar11 = uVar5 & 7;
      uVar15 = 0;
      uVar13 = 0;
      do {
        uVar13 = ((uint)CONCAT11(puVar16[uVar15 + uVar18],
                                 puVar16[uVar15 + uVar18 + 1] &
                                 BitReader::REMAINDER_MASKS[(ulong)uVar11 + 8]) << ((byte)uVar5 & 7)
                 ) >> 8 & 0xff | uVar13 << 8;
        uVar15 = uVar15 + 1;
      } while (uVar17 != uVar15);
    }
    uVar14 = bVar12 & 7;
    sVar7 = (sbyte)uVar14;
    bVar1 = puVar16[uVar17 + uVar18];
    bVar2 = BitReader::MASKS[uVar14];
    bVar3 = BitReader::REMAINDER_MASKS[(byte)(((byte)uVar5 & 7) + sVar7)];
    bVar4 = puVar16[(uVar17 + uVar18 + 1) - (ulong)(uVar11 + uVar14 < 8)];
    (state->input).index = bVar12 + uVar5;
    uVar6 = ((uint)(byte)((bVar3 & bVar4) >> (-(bVar12 + (byte)uVar5) & 7)) |
             ((uint)bVar2 & (uint)bVar1 << (sbyte)uVar11) >> (8U - sVar7 & 0x1f) | uVar13 << sVar7)
            << (bVar9 & 0x1f) ^ (uint)(state->ring_buffer).buffer[unpacked_data[uVar6].index];
    goto LAB_010379d4;
  case 2:
    uVar8 = state->leading_zeros;
    bVar12 = 0x20 - uVar8;
    if (bVar12 < 8) {
LAB_0103776c:
      uVar6 = (state->input).index;
      puVar16 = (state->input).input;
      uVar5 = uVar6 & 7;
      uVar15 = (ulong)(uVar6 >> 3);
      uVar18 = 0;
      uVar11 = 0;
    }
    else {
      puVar16 = (state->input).input;
      uVar6 = (state->input).index;
      uVar15 = (ulong)(uVar6 >> 3);
      uVar5 = uVar6 & 7;
      uVar18 = (ulong)(bVar12 >> 3);
      uVar17 = 0;
      uVar11 = 0;
      do {
        uVar11 = ((uint)CONCAT11(puVar16[uVar17 + uVar15],
                                 puVar16[uVar17 + uVar15 + 1] &
                                 BitReader::REMAINDER_MASKS[(ulong)uVar5 + 8]) << ((byte)uVar6 & 7))
                 >> 8 & 0xff | uVar11 << 8;
        uVar17 = uVar17 + 1;
      } while (uVar18 != uVar17);
    }
    break;
  case 3:
    uVar6 = *leading_zero_index;
    *leading_zero_index = uVar6 + 1;
    uVar8 = leading_zeros[uVar6];
    state->leading_zeros = uVar8;
    bVar12 = 0x20 - uVar8;
    if (bVar12 < 8) goto LAB_0103776c;
    puVar16 = (state->input).input;
    uVar6 = (state->input).index;
    uVar15 = (ulong)(uVar6 >> 3);
    uVar5 = uVar6 & 7;
    uVar18 = (ulong)(bVar12 >> 3);
    uVar17 = 0;
    uVar11 = 0;
    do {
      uVar11 = ((uint)CONCAT11(puVar16[uVar17 + uVar15],
                               puVar16[uVar17 + uVar15 + 1] &
                               BitReader::REMAINDER_MASKS[(ulong)uVar5 + 8]) << ((byte)uVar6 & 7))
               >> 8 & 0xff | uVar11 << 8;
      uVar17 = uVar17 + 1;
    } while (uVar18 != uVar17);
    break;
  default:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Chimp compression flag with value %d not recognized","");
    InternalException::InternalException<duckdb::ChimpConstants::Flags>
              (this,&local_50,(Flags)uVar15);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar13 = bVar12 & 7;
  sVar7 = (sbyte)uVar13;
  bVar9 = puVar16[uVar18 + uVar15];
  bVar1 = BitReader::MASKS[uVar13];
  bVar2 = BitReader::REMAINDER_MASKS[(byte)(((byte)uVar6 & 7) + sVar7)];
  bVar3 = puVar16[(uVar18 + uVar15 + 1) - (ulong)(uVar13 + uVar5 < 8)];
  (state->input).index = uVar6 + bVar12;
  uVar6 = (((uint)bVar1 & (uint)bVar9 << (sbyte)uVar5) >> (8U - sVar7 & 0x1f) | uVar11 << sVar7 |
          (uint)(byte)((bVar2 & bVar3) >> (uVar8 - (byte)uVar6 & 7))) ^ state->reference_value;
LAB_010379d4:
  state->reference_value = uVar6;
  uVar10 = (state->ring_buffer).index + 1;
  (state->ring_buffer).index = uVar10;
  (state->ring_buffer).buffer[(uint)uVar10 & 0x7f] = (ulong)uVar6;
  return uVar6;
}

Assistant:

static inline CHIMP_TYPE DecompressValue(ChimpConstants::Flags flag, uint8_t leading_zeros[],
	                                         uint32_t &leading_zero_index, UnpackedData unpacked_data[],
	                                         uint32_t &unpacked_index, DecompressState &state) {
		CHIMP_TYPE result;
		switch (flag) {
		case ChimpConstants::Flags::VALUE_IDENTICAL: {
			//! Value is identical to previous value
			auto index = state.input.template ReadValue<uint8_t, 7>();
			result = UnsafeNumericCast<CHIMP_TYPE>(state.ring_buffer.Value(index));
			break;
		}
		case ChimpConstants::Flags::TRAILING_EXCEEDS_THRESHOLD: {
			const UnpackedData &unpacked = unpacked_data[unpacked_index++];
			state.leading_zeros = unpacked.leading_zero;
			state.trailing_zeros = BIT_SIZE - unpacked.significant_bits - state.leading_zeros;
			result = state.input.template ReadValue<CHIMP_TYPE>(unpacked.significant_bits);
			result <<= state.trailing_zeros;
			result ^= state.ring_buffer.Value(unpacked.index);
			break;
		}
		case ChimpConstants::Flags::LEADING_ZERO_EQUALITY: {
			result = state.input.template ReadValue<CHIMP_TYPE>(BIT_SIZE - state.leading_zeros);
			result ^= state.reference_value;
			break;
		}
		case ChimpConstants::Flags::LEADING_ZERO_LOAD: {
			state.leading_zeros = leading_zeros[leading_zero_index++];
			D_ASSERT(state.leading_zeros <= BIT_SIZE);
			result = state.input.template ReadValue<CHIMP_TYPE>(BIT_SIZE - state.leading_zeros);
			result ^= state.reference_value;
			break;
		}
		default:
			throw InternalException("Chimp compression flag with value %d not recognized", flag);
		}
		state.reference_value = result;
		state.ring_buffer.InsertScan(result);
		return result;
	}